

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O3

void PrintExceptionContinue(exception *pex,string_view thread_name)

{
  FormatArg *args;
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string message;
  char *pszModule;
  string log_msg;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  string local_f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90 [4];
  string local_70;
  undefined1 local_50 [24];
  code *local_38;
  code *local_30;
  long local_28;
  
  local_50._8_8_ = thread_name._M_str;
  local_50._0_8_ = thread_name._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._M_dataplus._M_p = "bitcoin";
  if (pex == (exception *)0x0) {
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    tinyformat::format<char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (local_f0,(tinyformat *)"UNKNOWN EXCEPTION       \n%s in %s       \n",
               (char *)&local_70,(char **)args_00,in_R8);
  }
  else {
    local_90[0] = *(char **)(*(long *)(*(long *)pex + -8) + 8);
    local_90[0] = local_90[0] + (*local_90[0] == '*');
    local_b0._M_dataplus._M_p = (pointer)(**(code **)(*(long *)pex + 0x10))();
    args_00 = &local_b0;
    tinyformat::
    format<char_const*,char_const*,char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (local_f0,(tinyformat *)"EXCEPTION: %s       \n%s       \n%s in %s       \n",
               (char *)local_90,(char **)args_00,(char **)&local_70,(char **)local_50,
               in_stack_fffffffffffffee8);
  }
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar2);
  args = (FormatArg *)(local_50 + 0x10);
  if (bVar1) {
    local_50._8_8_ = (char *)0x0;
    local_50._16_8_ = local_50._16_8_ & 0xffffffffffffff00;
    local_50._0_8_ = args;
    tinyformat::format<std::__cxx11::string>
              (&local_70,(tinyformat *)"\n\n************************\n%s\n",(char *)local_f0,args_00
              );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               &local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pLVar2 = LogInstance();
    local_70._M_dataplus._M_p = (char *)0x5b;
    local_70._M_string_length = 0x1984ac;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/exception.cpp"
    ;
    source_file._M_len = 0x5b;
    str._M_str = (char *)local_50._0_8_;
    str._M_len = local_50._8_8_;
    logging_function._M_str = "PrintExceptionContinue";
    logging_function._M_len = 0x16;
    BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x27,ALL,Info);
    if ((FormatArg *)local_50._0_8_ != args) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
  }
  local_50._8_4_ = 1;
  local_50._16_8_ = local_f0;
  local_38 = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_30 = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_50._0_8_ = args;
  tinyformat::detail::formatImpl((ostream *)&std::cerr,"\n\n************************\n%s\n",args,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
    operator_delete(local_f0[0]._M_dataplus._M_p,local_f0[0].field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrintExceptionContinue(const std::exception* pex, std::string_view thread_name)
{
    std::string message = FormatException(pex, thread_name);
    LogPrintf("\n\n************************\n%s\n", message);
    tfm::format(std::cerr, "\n\n************************\n%s\n", message);
}